

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::stack
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  stack(this,&that->m_callbacks);
  _mv(this,that);
  return;
}

Assistant:

stack(stack &&that) noexcept : stack(that.m_callbacks)
    {
        _mv(&that);
    }